

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscPrintReceivedElements.cpp
# Opt level: O1

ostream * osc::operator<<(ostream *os,ReceivedPacket *p)

{
  bool bVar1;
  ReceivedMessage m;
  ReceivedMessage RStack_38;
  
  bVar1 = ReceivedPacket::IsBundle(p);
  if (bVar1) {
    ReceivedBundle::ReceivedBundle((ReceivedBundle *)&RStack_38,p);
    operator<<(os,(ReceivedBundle *)&RStack_38);
  }
  else {
    ReceivedMessage::ReceivedMessage(&RStack_38,p);
    operator<<(os,&RStack_38);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  return os;
}

Assistant:

std::ostream& operator<<( std::ostream & os, const ReceivedPacket& p )
{
    if( p.IsBundle() ){
        ReceivedBundle b(p);
        os << b << "\n";
    }else{
        ReceivedMessage m(p);
        os << m << "\n";
    }

    return os;
}